

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O0

void __thiscall
QDeviceDiscoveryUDev::QDeviceDiscoveryUDev
          (QDeviceDiscoveryUDev *this,QDeviceTypes types,udev *udev,QObject *parent)

{
  undefined4 uVar1;
  undefined8 uVar2;
  QSocketNotifier *this_00;
  QMessageLogger *in_RCX;
  undefined8 in_RDX;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QObject *in_stack_ffffffffffffff98;
  QDeviceDiscovery *in_stack_ffffffffffffffa0;
  int line;
  QObject local_38 [8];
  char local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDeviceDiscovery::QDeviceDiscovery
            (in_stack_ffffffffffffffa0,
             (QFlagsStorageHelper<QDeviceDiscovery::QDeviceType,_4>)SUB84((ulong)in_RDI >> 0x20,0),
             in_stack_ffffffffffffff98);
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  *(undefined ***)in_RDI = &PTR_metaObject_001a8f80;
  *(undefined8 *)(in_RDI + 0x18) = in_RDX;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  if (*(long *)(in_RDI + 0x18) != 0) {
    uVar2 = udev_monitor_new_from_netlink(*(undefined8 *)(in_RDI + 0x18),"udev");
    *(undefined8 *)(in_RDI + 0x20) = uVar2;
    if (*(long *)(in_RDI + 0x20) == 0) {
      QMessageLogger::QMessageLogger(in_RCX,(char *)in_RDI,line,(char *)in_stack_ffffffffffffff98);
      QMessageLogger::warning
                (local_30,"Unable to create an udev monitor. No devices can be detected.");
    }
    else {
      udev_monitor_filter_add_match_subsystem_devtype(*(undefined8 *)(in_RDI + 0x20),"input",0);
      udev_monitor_filter_add_match_subsystem_devtype(*(undefined8 *)(in_RDI + 0x20),"drm",0);
      udev_monitor_enable_receiving(*(undefined8 *)(in_RDI + 0x20));
      uVar1 = udev_monitor_get_fd(*(undefined8 *)(in_RDI + 0x20));
      *(undefined4 *)(in_RDI + 0x28) = uVar1;
      this_00 = (QSocketNotifier *)operator_new(0x10);
      QSocketNotifier::QSocketNotifier(this_00,(long)*(int *)(in_RDI + 0x28),Read,in_RDI);
      *(QSocketNotifier **)(in_RDI + 0x30) = this_00;
      QObject::connect(local_38,*(char **)(in_RDI + 0x30),(QObject *)"2activated(QSocketDescriptor)"
                       ,(char *)in_RDI,0x1882e3);
      QMetaObject::Connection::~Connection((Connection *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDeviceDiscoveryUDev::QDeviceDiscoveryUDev(QDeviceTypes types, struct udev *udev, QObject *parent) :
    QDeviceDiscovery(types, parent),
    m_udev(udev)
{
    if (!m_udev)
        return;

    m_udevMonitor = udev_monitor_new_from_netlink(m_udev, "udev");
    if (!m_udevMonitor) {
        qWarning("Unable to create an udev monitor. No devices can be detected.");
        return;
    }

    udev_monitor_filter_add_match_subsystem_devtype(m_udevMonitor, "input", 0);
    udev_monitor_filter_add_match_subsystem_devtype(m_udevMonitor, "drm", 0);
    udev_monitor_enable_receiving(m_udevMonitor);
    m_udevMonitorFileDescriptor = udev_monitor_get_fd(m_udevMonitor);

    m_udevSocketNotifier = new QSocketNotifier(m_udevMonitorFileDescriptor, QSocketNotifier::Read, this);
    connect(m_udevSocketNotifier, SIGNAL(activated(QSocketDescriptor)), this, SLOT(handleUDevNotification()));
}